

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::_q_contentsChanged
          (QWidgetTextControlPrivate *this,int from,int charsRemoved,int charsAdded)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  QAccessibleTextUpdateEvent *this_00;
  MoveMode MVar6;
  int iVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QTextCursor tmp;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&this->field_0x8;
  cVar4 = QAccessible::isActive();
  if (((cVar4 != '\0') && (lVar3 = *(long *)(*(long *)(lVar2 + 8) + 0x10), lVar3 != 0)) &&
     ((*(byte *)(*(long *)(lVar3 + 8) + 0x30) & 1) != 0)) {
    _tmp = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&tmp,this->doc);
    iVar7 = (int)&tmp;
    QTextCursor::setPosition(iVar7,from);
    iVar5 = QTextDocument::characterCount();
    MVar6 = charsAdded + from;
    if ((int)(iVar5 - KeepAnchor) < charsAdded + from) {
      MVar6 = iVar5 - KeepAnchor;
    }
    QTextCursor::setPosition(iVar7,MVar6);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::selectedText();
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)&local_78,(long)charsRemoved,(QChar)0x20);
    if (charsRemoved == 0) {
      this_00 = (QAccessibleTextUpdateEvent *)operator_new(0x40);
      QAccessibleTextInsertEvent::QAccessibleTextInsertEvent
                ((QAccessibleTextInsertEvent *)this_00,*(QObject **)(*(long *)(lVar2 + 8) + 0x10),
                 from,(QString *)&local_58);
    }
    else if (charsAdded == 0) {
      this_00 = (QAccessibleTextUpdateEvent *)operator_new(0x40);
      QAccessibleTextRemoveEvent::QAccessibleTextRemoveEvent
                ((QAccessibleTextRemoveEvent *)this_00,*(QObject **)(*(long *)(lVar2 + 8) + 0x10),
                 from,(QString *)&local_78);
    }
    else {
      this_00 = (QAccessibleTextUpdateEvent *)operator_new(0x58);
      QAccessibleTextUpdateEvent::QAccessibleTextUpdateEvent
                (this_00,*(QObject **)(*(long *)(lVar2 + 8) + 0x10),from,(QString *)&local_78,
                 (QString *)&local_58);
    }
    QAccessible::updateAccessibility((QAccessibleEvent *)this_00);
    (**(code **)(*(long *)this_00 + 8))(this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QTextCursor::~QTextCursor(&tmp);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::_q_contentsChanged(int from, int charsRemoved, int charsAdded)
{
#if QT_CONFIG(accessibility)
    Q_Q(QWidgetTextControl);

    if (QAccessible::isActive() && q->parent() && q->parent()->isWidgetType()) {
        QTextCursor tmp(doc);
        tmp.setPosition(from);
        // when setting a new text document the length is off
        // QTBUG-32583 - characterCount is off by 1 requires the -1
        tmp.setPosition(qMin(doc->characterCount() - 1, from + charsAdded), QTextCursor::KeepAnchor);
        QString newText = tmp.selectedText();

        // always report the right number of removed chars, but in lack of the real string use spaces
        QString oldText = QString(charsRemoved, u' ');

        QAccessibleEvent *ev = nullptr;
        if (charsRemoved == 0) {
            ev = new QAccessibleTextInsertEvent(q->parent(), from, newText);
        } else if (charsAdded == 0) {
            ev = new QAccessibleTextRemoveEvent(q->parent(), from, oldText);
        } else {
            ev = new QAccessibleTextUpdateEvent(q->parent(), from, oldText, newText);
        }
        QAccessible::updateAccessibility(ev);
        delete ev;
    }
#else
    Q_UNUSED(from);
    Q_UNUSED(charsRemoved);
    Q_UNUSED(charsAdded);
#endif
}